

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_addsur_h_ssov(CPUTriCoreState *env,uint64_t r1,uint32_t r2_l,uint32_t r2_h)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  lVar1 = (long)(int)r2_l - (long)(int)r1;
  lVar2 = (long)(int)r2_h + ((long)r1 >> 0x20);
  uVar4 = (int)lVar1 + 0x8000;
  uVar6 = (int)lVar2 + 0x8000;
  uVar5 = (uint)(lVar2 - 0x7fff8000U < 0xffffffff00000000 ||
                lVar1 - 0x7fff8000U < 0xffffffff00000000) << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar5;
  uVar7 = (int)lVar1 * 2 + 0x10000U ^ uVar4 | (int)lVar2 * 2 + 0x10000U ^ uVar6;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar7;
  uVar3 = 0x80000000;
  if (-0x80008001 < lVar2) {
    uVar3 = uVar6 & 0xffff0000;
  }
  uVar4 = uVar4 >> 0x10;
  if (lVar1 < -0x80008000) {
    uVar4 = 0x8000;
  }
  uVar6 = 0x7fff0000;
  if (lVar2 < 0x7fff8000) {
    uVar6 = uVar3;
  }
  env->PSW_USB_V = uVar5;
  env->PSW_USB_AV = uVar7;
  uVar3 = 0x7fff;
  if (lVar1 < 0x7fff8000) {
    uVar3 = uVar4;
  }
  return uVar3 | uVar6;
}

Assistant:

uint32_t helper_addsur_h_ssov(CPUTriCoreState *env, uint64_t r1, uint32_t r2_l,
                              uint32_t r2_h)
{
    int64_t mul_res0 = sextract64(r1, 0, 32);
    int64_t mul_res1 = sextract64(r1, 32, 32);
    int64_t r2_low = sextract64(r2_l, 0, 32);
    int64_t r2_high = sextract64(r2_h, 0, 32);
    int64_t result0, result1;
    uint32_t ovf0, ovf1;
    uint32_t avf0, avf1;

    ovf0 = ovf1 = 0;

    result0 = r2_low - mul_res0 + 0x8000;
    result1 = r2_high + mul_res1 + 0x8000;

    avf0 = result0 * 2u;
    avf0 = result0 ^ avf0;
    avf1 = result1 * 2u;
    avf1 = result1 ^ avf1;

    if (result0 > INT32_MAX) {
        ovf0 = (1 << 31);
        result0 = INT32_MAX;
    } else if (result0 < INT32_MIN) {
        ovf0 = (1 << 31);
        result0 = INT32_MIN;
    }

    if (result1 > INT32_MAX) {
        ovf1 = (1 << 31);
        result1 = INT32_MAX;
    } else if (result1 < INT32_MIN) {
        ovf1 = (1 << 31);
        result1 = INT32_MIN;
    }

    env->PSW_USB_V = ovf0 | ovf1;
    env->PSW_USB_SV |= env->PSW_USB_V;

    env->PSW_USB_AV = avf0 | avf1;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return (result1 & 0xffff0000ULL) | ((result0 >> 16) & 0xffffULL);
}